

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseBlock(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  TidyParserMemory *pTVar3;
  Dict *pDVar4;
  bool bVar5;
  Bool BVar6;
  int iVar7;
  Node *pNVar8;
  long lVar9;
  tmbstr ptVar10;
  Dict *pDVar11;
  Node *pNVar12;
  Node **ppNVar13;
  Node **ppNVar14;
  GetTokenMode mode_00;
  TidyTagId TVar15;
  uint uVar16;
  GetTokenMode mode_01;
  TidyParserMemory memory;
  undefined4 local_74;
  
  pLVar2 = doc->lexer;
  if (element == (Node *)0x0) {
    iVar7 = (doc->stack).top;
    lVar9 = (long)iVar7;
    if (lVar9 < 0) {
      uVar16 = 0;
      element = (Node *)0x0;
      mode_01 = IgnoreWhitespace;
    }
    else {
      uVar16 = 0;
      pTVar3 = (doc->stack).content;
      element = pTVar3[lVar9].original_node;
      mode_01 = pTVar3[lVar9].reentry_mode;
      (doc->stack).top = iVar7 + -1;
    }
  }
  else {
    pDVar11 = element->tag;
    if ((pDVar11->model & 1) != 0) {
      return (Node *)0x0;
    }
    if ((((pDVar11 != (Dict *)0x0) && (pDVar11->id == TidyTag_DIV)) &&
        (element->parent != (Node *)0x0)) &&
       (((pDVar11 = element->parent->tag, pDVar11 != (Dict *)0x0 && (pDVar11->id == TidyTag_DL)) &&
        (BVar6 = prvTidyIsHTML5Mode(doc), BVar6 != no)))) {
      pNVar8 = prvTidyParseDefList(doc,element,mode_00);
      return pNVar8;
    }
    if ((element->tag != (Dict *)0x0) && (element->tag->id == TidyTag_FORM)) {
      for (pNVar8 = element->parent; pNVar8 != (Node *)0x0; pNVar8 = pNVar8->parent) {
        if ((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_FORM)) {
          prvTidyReport(doc,element,(Node *)0x0,0x243);
          break;
        }
      }
    }
    uVar1 = element->tag->model;
    uVar16 = 0;
    if ((uVar1 >> 0xb & 1) != 0) {
      uVar16 = pLVar2->istackbase;
      pLVar2->istackbase = pLVar2->istacksize;
    }
    if ((uVar1 >> 0x11 & 1) == 0) {
      prvTidyInlineDup(doc,(Node *)0x0);
    }
    mode_01 = IgnoreWhitespace;
    if ((element->tag->model & 0x410) == 0x10) {
      mode_01 = mode + (mode == IgnoreWhitespace);
    }
  }
  pNVar8 = prvTidyGetToken(doc,mode_01);
  if (pNVar8 == (Node *)0x0) {
LAB_0013a964:
    if ((element->tag->model & 0x8000) == 0) {
      prvTidyReport(doc,element,pNVar8,0x25a);
    }
    if ((element->tag->model & 0x800) == 0) goto LAB_0013aaf9;
    while (pLVar2->istackbase < pLVar2->istacksize) {
      prvTidyPopInline(doc,(Node *)0x0);
    }
LAB_0013aaed:
    pLVar2->istackbase = uVar16;
LAB_0013aaf9:
    TrimSpaces(doc,element);
    return (Node *)0x0;
  }
  ppNVar13 = &element->content;
  bVar5 = true;
LAB_0013a152:
  if (((pNVar8->type == EndTag) && (pDVar11 = pNVar8->tag, pDVar11 != (Dict *)0x0)) &&
     ((pDVar11 == element->tag || (element->was == pDVar11)))) {
    prvTidyFreeNode(doc,pNVar8);
    if ((element->tag->model & 0x800) != 0) {
      while (pLVar2->istackbase < pLVar2->istacksize) {
        prvTidyPopInline(doc,(Node *)0x0);
      }
      pLVar2->istackbase = uVar16;
    }
    element->closed = yes;
    goto LAB_0013aaf9;
  }
  pDVar11 = pNVar8->tag;
  if ((pDVar11 != (Dict *)0x0) &&
     ((pDVar11->id == TidyTag_HTML ||
      ((pDVar11 != (Dict *)0x0 &&
       ((pDVar11->id == TidyTag_HEAD || ((pDVar11 != (Dict *)0x0 && (pDVar11->id == TidyTag_BODY))))
       )))))) {
    BVar6 = prvTidynodeIsElement(pNVar8);
    if (BVar6 != no) goto LAB_0013a5e2;
LAB_0013a5f7:
    prvTidyFreeNode(doc,pNVar8);
LAB_0013a602:
    pNVar8 = prvTidyGetToken(doc,mode_01);
    if (pNVar8 == (Node *)0x0) goto LAB_0013a964;
    goto LAB_0013a152;
  }
  if (pNVar8->type != EndTag) goto LAB_0013a23c;
  if (pDVar11 == (Dict *)0x0) goto LAB_0013a5e2;
  TVar15 = pDVar11->id;
  if (TVar15 != TidyTag_P) {
    if (TVar15 == TidyTag_BR) {
      pNVar8->type = StartTag;
      goto LAB_0013a23c;
    }
    for (pNVar12 = element->parent; pNVar12 != (Node *)0x0; pNVar12 = pNVar12->parent) {
      if ((pNVar12->tag != (Dict *)0x0) && (pNVar12->tag->id == TVar15)) {
        prvTidyUngetToken(doc);
        goto LAB_0013a964;
      }
    }
    if ((pLVar2->exiled == no) ||
       ((BVar6 = prvTidynodeHasCM(pNVar8,0x80), BVar6 == no &&
        ((pNVar8->tag == (Dict *)0x0 || (pNVar8->tag->id != TidyTag_TABLE)))))) goto LAB_0013a23c;
LAB_0013a9ca:
    prvTidyUngetToken(doc);
    goto LAB_0013aaf9;
  }
  pNVar8->type = StartEndTag;
  pNVar8->implicit = yes;
LAB_0013a23c:
  BVar6 = prvTidynodeIsText(pNVar8);
  if (BVar6 != no) {
    if (((bVar5) && ((element->tag->model & 0x20000) == 0)) &&
       (iVar7 = prvTidyInlineDup(doc,pNVar8), 0 < iVar7)) {
LAB_0013a266:
      bVar5 = false;
      goto LAB_0013a602;
    }
    pNVar8->parent = element;
    if (element == (Node *)0x0) {
      pNVar8->prev = (Node *)0x0;
LAB_0013a328:
      if (element != (Node *)0x0) {
        element->content = pNVar8;
LAB_0013a331:
        element->last = pNVar8;
        pDVar11 = element->tag;
        bVar5 = false;
        mode_01 = MixedContent;
        if ((pDVar11 != (Dict *)0x0) &&
           ((pDVar11->id == TidyTag_BODY ||
            ((pDVar11 != (Dict *)0x0 &&
             ((pDVar11->id == TidyTag_MAP ||
              ((pDVar11 != (Dict *)0x0 &&
               ((pDVar11->id == TidyTag_BLOCKQUOTE ||
                ((pDVar11 != (Dict *)0x0 &&
                 ((pDVar11->id == TidyTag_FORM ||
                  ((pDVar11 != (Dict *)0x0 && (pDVar11->id == TidyTag_NOSCRIPT)))))))))))))))))) {
          prvTidyConstrainVersion(doc,0xfffffedb);
        }
        goto LAB_0013a602;
      }
    }
    else {
      pNVar12 = element->last;
      pNVar8->prev = pNVar12;
      if (pNVar12 == (Node *)0x0) goto LAB_0013a328;
      pNVar12->next = pNVar8;
      if (element != (Node *)0x0) goto LAB_0013a331;
    }
    bVar5 = false;
    mode_01 = MixedContent;
    goto LAB_0013a602;
  }
  BVar6 = InsertMisc(element,pNVar8);
  if (BVar6 != no) goto LAB_0013a602;
  pDVar11 = pNVar8->tag;
  if (pDVar11 == (Dict *)0x0) goto LAB_0013a5e2;
  if (pDVar11->id == TidyTag_PARAM) {
    BVar6 = prvTidynodeHasCM(element,0x1000);
    if ((BVar6 != no) && (BVar6 = prvTidynodeIsElement(pNVar8), BVar6 != no)) {
      pNVar8->parent = element;
      if (element == (Node *)0x0) {
        pNVar8->prev = (Node *)0x0;
      }
      else {
        pNVar12 = element->last;
        pNVar8->prev = pNVar12;
        if (pNVar12 != (Node *)0x0) {
          pNVar12->next = pNVar8;
          if (element != (Node *)0x0) goto LAB_0013a4bf;
          goto LAB_0013a602;
        }
      }
      if (element != (Node *)0x0) {
        element->content = pNVar8;
LAB_0013a4bf:
        element->last = pNVar8;
      }
      goto LAB_0013a602;
    }
    goto LAB_0013a5e2;
  }
  if (pDVar11 == (Dict *)0x0) goto LAB_0013a5e2;
  if (pDVar11->id == TidyTag_AREA) {
    if ((((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
        (element->tag->id == TidyTag_MAP)) && (BVar6 = prvTidynodeIsElement(pNVar8), BVar6 != no)) {
      pNVar8->parent = element;
      pNVar12 = element->last;
      pNVar8->prev = pNVar12;
      ppNVar14 = &pNVar12->next;
      if (pNVar12 == (Node *)0x0) {
        ppNVar14 = ppNVar13;
      }
      *ppNVar14 = pNVar8;
      goto LAB_0013a4bf;
    }
    goto LAB_0013a5e2;
  }
  if (pDVar11 == (Dict *)0x0) goto LAB_0013a5e2;
  BVar6 = prvTidynodeHasCM(pNVar8,0x10);
  if (BVar6 == no) {
    BVar6 = prvTidynodeIsElement(pNVar8);
    if (BVar6 == no) {
      if ((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_FORM)) {
        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
      }
      goto LAB_0013a5e2;
    }
    if ((element == (Node *)0x0) || (pDVar11 = element->tag, pDVar11 == (Dict *)0x0)) {
LAB_0013a5ab:
      BVar6 = prvTidynodeHasCM(pNVar8,8);
      if (BVar6 == no) {
        if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
           (element->tag->id == TidyTag_TEMPLATE)) goto LAB_0013a427;
        pDVar11 = pNVar8->tag;
        if ((pDVar11->model & 4) != 0) goto LAB_0013a798;
        if (((((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
             ((element->tag->id == TidyTag_FORM &&
              ((pNVar12 = element->parent, pNVar12 != (Node *)0x0 && (pNVar12->tag != (Dict *)0x0)))
              ))) && (pNVar12->tag->id == TidyTag_TD)) &&
           ((pNVar12->implicit != no && (pDVar11 != (Dict *)0x0)))) {
          if (pDVar11->id == TidyTag_TD) goto LAB_0013a5e2;
          if ((pDVar11 != (Dict *)0x0) && (pDVar11->id == TidyTag_TH)) {
            prvTidyReport(doc,element,pNVar8,0x235);
            prvTidyFreeNode(doc,pNVar8);
            pNVar8 = element->parent;
            (*doc->allocator->vtbl->free)(doc->allocator,pNVar8->element);
            ptVar10 = prvTidytmbstrdup(doc->allocator,"th");
            pNVar8->element = ptVar10;
            pDVar11 = prvTidyLookupTagDef(TidyTag_TH);
            pNVar8->tag = pDVar11;
            goto LAB_0013a602;
          }
        }
        BVar6 = prvTidynodeHasCM(element,0x8000);
        if ((BVar6 == no) && (element->implicit == no)) {
          prvTidyReport(doc,element,pNVar8,0x259);
        }
        if ((*(int *)((doc->config).value + 0x3b) == 0) &&
           (BVar6 = prvTidynodeHasCM(element,0x8000), BVar6 != no)) {
          prvTidyReport(doc,element,pNVar8,0x25b);
        }
        prvTidyUngetToken(doc);
        BVar6 = prvTidynodeHasCM(pNVar8,0x20);
        if (BVar6 == no) {
          BVar6 = prvTidynodeHasCM(pNVar8,0x40);
          if (BVar6 == no) {
            BVar6 = prvTidynodeHasCM(pNVar8,0x80);
            if ((BVar6 == no) && (BVar6 = prvTidynodeHasCM(pNVar8,0x200), BVar6 == no)) {
              BVar6 = prvTidynodeHasCM(element,0x800);
              if (BVar6 == no) goto LAB_0013aaf9;
              while (pLVar2->istackbase < pLVar2->istacksize) {
                prvTidyPopInline(doc,(Node *)0x0);
              }
              goto LAB_0013aaed;
            }
            if (pLVar2->exiled != no) {
              return (Node *)0x0;
            }
            TVar15 = TidyTag_TABLE;
          }
          else {
            if (((element->parent != (Node *)0x0) &&
                (pDVar11 = element->parent->tag, pDVar11 != (Dict *)0x0)) &&
               (pDVar11->id == TidyTag_DL)) goto LAB_0013aaf9;
            TVar15 = TidyTag_DL;
          }
          pNVar8 = prvTidyInferredTag(doc,TVar15);
        }
        else {
          if (((element->parent != (Node *)0x0) &&
              (pDVar11 = element->parent->tag, pDVar11 != (Dict *)0x0)) &&
             (pDVar11->parser == prvTidyParseList)) goto LAB_0013aaf9;
          pNVar8 = prvTidyInferredTag(doc,TidyTag_UL);
          AddClassNoIndent(doc,pNVar8);
        }
      }
      else if (pLVar2->excludeBlocks != no) {
        BVar6 = prvTidynodeHasCM(element,0x8000);
        if (BVar6 == no) {
          prvTidyReport(doc,element,pNVar8,0x259);
        }
        prvTidyUngetToken(doc);
        BVar6 = prvTidynodeHasCM(element,0x800);
        if (BVar6 == no) goto LAB_0013aaf9;
        goto LAB_0013aaed;
      }
    }
    else {
      if (((pDVar11->id == TidyTag_LI) && (pDVar4 = pNVar8->tag, pDVar4 != (Dict *)0x0)) &&
         ((pDVar4->id == TidyTag_FRAME ||
          ((pDVar4 != (Dict *)0x0 &&
           ((pDVar4->id == TidyTag_FRAMESET ||
            ((pDVar4 != (Dict *)0x0 &&
             ((pDVar4->id == TidyTag_OPTGROUP ||
              ((pDVar4 != (Dict *)0x0 && (pDVar4->id == TidyTag_OPTION))))))))))))))
      goto LAB_0013a5e2;
      if ((pDVar11 == (Dict *)0x0) ||
         ((pDVar11->id != TidyTag_TD && ((pDVar11 == (Dict *)0x0 || (pDVar11->id != TidyTag_TH))))))
      goto LAB_0013a5ab;
      BVar6 = prvTidynodeHasCM(pNVar8,4);
      if (BVar6 != no) {
LAB_0013a798:
        MoveToHead(doc,element,pNVar8);
        goto LAB_0013a602;
      }
      BVar6 = prvTidynodeHasCM(pNVar8,0x20);
      if (BVar6 == no) {
        BVar6 = prvTidynodeHasCM(pNVar8,0x40);
        if (BVar6 != no) {
          prvTidyUngetToken(doc);
          pNVar8 = prvTidyInferredTag(doc,TidyTag_DL);
          goto LAB_0013a8c3;
        }
      }
      else {
        prvTidyUngetToken(doc);
        pNVar8 = prvTidyInferredTag(doc,TidyTag_UL);
        AddClassNoIndent(doc,pNVar8);
LAB_0013a8c3:
        pLVar2->excludeBlocks = yes;
      }
      BVar6 = prvTidynodeHasCM(pNVar8,8);
      if (BVar6 == no) goto LAB_0013a9ca;
    }
  }
LAB_0013a427:
  if (((pNVar8 != (Node *)0x0) && (pNVar8->tag != (Dict *)0x0)) &&
     ((pNVar8->tag->id == TidyTag_A && (pNVar8->implicit == no)))) {
    if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
       (element->tag->id == TidyTag_A)) {
LAB_0013a729:
      if ((pNVar8->type != EndTag) &&
         ((pNVar8->attributes == (AttVal *)0x0 && (*(int *)((doc->config).value + 9) != 0)))) {
        pNVar8->type = EndTag;
        prvTidyReport(doc,element,pNVar8,0x232);
        prvTidyUngetToken(doc);
        goto LAB_0013a602;
      }
      if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
         (element->tag->id != TidyTag_A)) {
        prvTidyReport(doc,element,pNVar8,0x235);
        prvTidyFreeNode(doc,pNVar8);
      }
      else {
        prvTidyReport(doc,element,pNVar8,0x259);
        prvTidyUngetToken(doc);
      }
      if ((mode_01 & Preformatted) != IgnoreWhitespace) {
        return (Node *)0x0;
      }
      goto LAB_0013aaf9;
    }
    for (pNVar12 = element->parent; pNVar12 != (Node *)0x0; pNVar12 = pNVar12->parent) {
      if ((pNVar12->tag != (Dict *)0x0) && (pNVar12->tag->id == TidyTag_A)) goto LAB_0013a729;
    }
  }
  BVar6 = prvTidynodeIsElement(pNVar8);
  if (BVar6 != no) {
    if ((pNVar8->tag->model & 0x10) == 0) {
      local_74 = 0;
    }
    else {
      local_74 = 1;
      if (((bVar5) && (pNVar8->implicit == no)) &&
         (((element->tag->model & 0x20000) == 0 && (iVar7 = prvTidyInlineDup(doc,pNVar8), 0 < iVar7)
          ))) goto LAB_0013a266;
    }
    if (((pNVar8 != (Node *)0x0) && (pNVar8->tag != (Dict *)0x0)) && (pNVar8->tag->id == TidyTag_BR)
       ) {
      TrimSpaces(doc,element);
    }
    pNVar8->parent = element;
    if (element == (Node *)0x0) {
      pNVar8->prev = (Node *)0x0;
LAB_0013aa24:
      if (element == (Node *)0x0) goto LAB_0013aa3a;
    }
    else {
      pNVar12 = element->last;
      pNVar8->prev = pNVar12;
      if (pNVar12 == (Node *)0x0) goto LAB_0013aa24;
      ppNVar13 = &pNVar12->next;
    }
    *ppNVar13 = pNVar8;
    if (element != (Node *)0x0) {
      element->last = pNVar8;
    }
LAB_0013aa3a:
    if (pNVar8->implicit != no) {
      prvTidyReport(doc,element,pNVar8,0x247);
    }
    prvTidypushMemory(doc,(TidyParserMemory)
                          ZEXT2848(CONCAT424(local_74,CONCAT816(pNVar8,CONCAT88(element,
                                                  prvTidyParseBlock)))));
    return pNVar8;
  }
  if (pNVar8->type == EndTag) {
    prvTidyPopInline(doc,pNVar8);
  }
LAB_0013a5e2:
  prvTidyReport(doc,element,pNVar8,0x235);
  goto LAB_0013a5f7;
}

Assistant:

Node* TY_(ParseBlock)( TidyDocImpl* doc, Node *element, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool checkstack = yes;
    uint istackbase = 0;
    DEBUG_LOG_COUNTERS;
    
    if ( element == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, because the loop overwrites this immediately. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        element = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.reentry_mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(element);

        if ( element->tag->model & CM_EMPTY )
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }

        if ( nodeIsDIV(element) && nodeIsDL(element->parent) && TY_(IsHTML5Mode)(doc) )
        {
            DEBUG_LOG_EXIT;
            return TY_(ParseDefList)(doc, element, mode); /* @warning: possible recursion! */
        }
        
        if ( nodeIsFORM(element) && DescendantOf(element, TidyTag_FORM) )
        {
            TY_(Report)(doc, element, NULL, ILLEGAL_NESTING );
        }

        /*
         InlineDup() asks the lexer to insert inline emphasis tags
         currently pushed on the istack, but take care to avoid
         propagating inline emphasis inside OBJECT or APPLET.
         For these elements a fresh inline stack context is created
         and disposed of upon reaching the end of the element.
         They thus behave like table cells in this respect.
        */
        if (element->tag->model & CM_OBJECT)
        {
            istackbase = lexer->istackbase;
            lexer->istackbase = lexer->istacksize;
        }

        if (!(element->tag->model & CM_MIXED))
        {
            TY_(InlineDup)( doc, NULL );
        }

        /*\
         *  Issue #212 - If it is likely that it may be necessary
         *  to move a leading space into a text node before this
         *  element, then keep the mode MixedContent to keep any
         *  leading space
        \*/
        if ( !(element->tag->model & CM_INLINE) ||
              (element->tag->model & CM_FIELD ) )
        {
            DEBUG_LOG_GET_OLD_MODE;
            mode = IgnoreWhitespace;
            DEBUG_LOG_CHANGE_MODE;
        }
        else if (mode == IgnoreWhitespace)
        {
            /* Issue #212 - Further fix in case ParseBlock() is called with 'IgnoreWhitespace'
               when such a leading space may need to be inserted before this element to
               preserve the browser view */
            DEBUG_LOG_GET_OLD_MODE;
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
        }
    } /* Re-Entering */
    
    /*
     Main Loop
     */
    
    while ((node = TY_(GetToken)(doc, mode /*MixedContent*/)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        /* end tag for this element */
        if (node->type == EndTag && node->tag &&
            (node->tag == element->tag || element->was == node->tag))
        {
            TY_(FreeNode)( doc, node );

            if (element->tag->model & CM_OBJECT)
            {
                /* pop inline stack */
                while (lexer->istacksize > lexer->istackbase)
                    TY_(PopInline)( doc, NULL );
                lexer->istackbase = istackbase;
            }

            element->closed = yes;
            TrimSpaces( doc, element );
            DEBUG_LOG_EXIT;
            return NULL;
        }

        if ( nodeIsHTML(node) || nodeIsHEAD(node) || nodeIsBODY(node) )
        {
            if ( TY_(nodeIsElement)(node) )
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }


        if (node->type == EndTag)
        {
            if (node->tag == NULL)
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            else if ( nodeIsBR(node) )
            {
                node->type = StartTag;
            }
            else if ( nodeIsP(node) )
            {
                /* Cannot have a block inside a paragraph, so no checking
                   for an ancestor is necessary -- but we _can_ have
                   paragraphs inside a block, so change it to an implicit
                   empty paragraph, to be dealt with according to the user's
                   options
                */
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if (DescendantOf( element, node->tag->id ))
            {
                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                TY_(UngetToken)( doc );
                break;
            }
            else
            {
                /* special case </tr> etc. for stuff moved in front of table */
                if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if ( checkstack )
            {
                checkstack = no;
                if (!(element->tag->model & CM_MIXED))
                {
                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
            }

            TY_(InsertNodeAtEnd)(element, node);
            DEBUG_LOG_GET_OLD_MODE
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
            /*
              HTML4 strict doesn't allow mixed content for
              elements with %block; as their content model
            */
            /*
              But only body, map, blockquote, form and
              noscript have content model %block;
            */
            if ( nodeIsBODY(element)       ||
                 nodeIsMAP(element)        ||
                 nodeIsBLOCKQUOTE(element) ||
                 nodeIsFORM(element)       ||
                 nodeIsNOSCRIPT(element) )
                TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            continue;
        }

        if ( InsertMisc(element, node) )
            continue;

        /* allow PARAM elements? */
        if ( nodeIsPARAM(node) )
        {
            if ( TY_(nodeHasCM)(element, CM_PARAM) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* allow AREA elements? */
        if ( nodeIsAREA(node) )
        {
            if ( nodeIsMAP(element) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* ignore unknown start/end tags */
        if ( node->tag == NULL )
        {
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /*
          Allow CM_INLINE elements here.

          Allow CM_BLOCK elements here unless
          lexer->excludeBlocks is yes.

          LI and DD are special cased.

          Otherwise infer end tag for this element.
        */

        if ( !TY_(nodeHasCM)(node, CM_INLINE) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            
            /* #427671 - Fix by Randy Waki - 10 Aug 00 */
            /*
             If an LI contains an illegal FRAME, FRAMESET, OPTGROUP, or OPTION
             start tag, discard the start tag and let the subsequent content get
             parsed as content of the enclosing LI.  This seems to mimic IE and
             Netscape, and avoids an infinite loop: without this check,
             ParseBlock (which is parsing the LI's content) and ParseList (which
             is parsing the LI's parent's content) repeatedly defer to each
             other to parse the illegal start tag, each time inferring a missing
             </li> or <li> respectively.

             NOTE: This check is a bit fragile.  It specifically checks for the
             four tags that happen to weave their way through the current series
             of tests performed by ParseBlock and ParseList to trigger the
             infinite loop.
            */
            if ( nodeIsLI(element) )
            {
                if ( nodeIsFRAME(node)    ||
                     nodeIsFRAMESET(node) ||
                     nodeIsOPTGROUP(node) ||
                     nodeIsOPTION(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                    TY_(FreeNode)( doc, node );  /* DSR - 27Apr02 avoid memory leak */
                    continue;
                }
            }

            if ( nodeIsTD(element) || nodeIsTH(element) )
            {
                /* if parent is a table cell, avoid inferring the end of the cell */

                if ( TY_(nodeHasCM)(node, CM_HEAD) )
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                    lexer->excludeBlocks = yes;
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DL);
                    lexer->excludeBlocks = yes;
                }

                /* infer end of current table cell */
                if ( !TY_(nodeHasCM)(node, CM_BLOCK) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
            else if ( TY_(nodeHasCM)(node, CM_BLOCK) )
            {
                if ( lexer->excludeBlocks )
                {
                    if ( !TY_(nodeHasCM)(element, CM_OPT) )
                        TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );

                    TY_(UngetToken)( doc );

                    if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                        lexer->istackbase = istackbase;

                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
            else if ( ! nodeIsTEMPLATE( element ) )/* things like list items */
            {
                if (node->tag->model & CM_HEAD)
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                /*
                 special case where a form start tag
                 occurs in a tr and is followed by td or th
                */

                if ( nodeIsFORM(element) &&
                     nodeIsTD(element->parent) &&
                     element->parent->implicit )
                {
                    if ( nodeIsTD(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    if ( nodeIsTH(node) )
                    {
                        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        node = element->parent;
                        TidyDocFree(doc, node->element);
                        node->element = TY_(tmbstrdup)(doc->allocator, "th");
                        node->tag = TY_(LookupTagDef)( TidyTag_TH );
                        continue;
                    }
                }

                if ( !TY_(nodeHasCM)(element, CM_OPT) && !element->implicit )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );

                /* #521, warn on missing optional end-tags if not omitting them. */
                if ( cfgBool( doc, TidyOmitOptionalTags ) == no && TY_(nodeHasCM)(element, CM_OPT) )
                    TY_(Report)(doc, element, node, MISSING_ENDTAG_OPTIONAL );


                TY_(UngetToken)( doc );

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    if ( element->parent && element->parent->tag &&
                         element->parent->tag->parser == TY_(ParseList) )
                    {
                        TrimSpaces( doc, element );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    if ( nodeIsDL(element->parent) )
                    {
                        TrimSpaces( doc, element );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DL);
                }
                else if ( TY_(nodeHasCM)(node, CM_TABLE) || TY_(nodeHasCM)(node, CM_ROW) )
                {
                    /* http://tidy.sf.net/issue/1316307 */
                    /* In exiled mode, return so table processing can
                       continue. */
                    if (lexer->exiled)
                    {
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                else if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                {
                    /* pop inline stack */
                    while ( lexer->istacksize > lexer->istackbase )
                        TY_(PopInline)( doc, NULL );
                    lexer->istackbase = istackbase;
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;

                }
                else
                {
                    TrimSpaces( doc, element );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        /*\
         *  Issue #307 - an <A> tag to ends any open <A> element
         *  Like #427827 - fixed by Randy Waki and Bjoern Hoehrmann 23 Aug 00
         *  in ParseInline(), fix copied HERE to ParseBlock()
         *  href: http://www.w3.org/TR/html-markup/a.html
         *  The interactive element a must not appear as a descendant of the a element.
        \*/
        if ( nodeIsA(node) && !node->implicit &&
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                TY_(UngetToken)( doc );
                continue;
            }

            if (nodeIsA(element))
            {
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);
                TY_(UngetToken)( doc );
            }
            else
            {
                /* Issue #597 - if we not 'UngetToken' then it is being discarded.
                   Add message, and 'FreeNode' - thanks @ralfjunker */
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
            }

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* parse known element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->tag->model & CM_INLINE)
            {
                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if (!(element->tag->model & CM_MIXED)) /* #431731 - fix by Randy Waki 25 Dec 00 */
                    {
                        if ( TY_(InlineDup)(doc, node) > 0 )
                            continue;
                    }
                }

                DEBUG_LOG_GET_OLD_MODE;
                mode = MixedContent;
                DEBUG_LOG_CHANGE_MODE;
            }
            else
            {
                checkstack = yes;
                DEBUG_LOG_GET_OLD_MODE;
                mode = IgnoreWhitespace;
                DEBUG_LOG_CHANGE_MODE;
            }

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces( doc, element );

            TY_(InsertNodeAtEnd)(element, node);

            if (node->implicit)
                TY_(Report)(doc, element, node, INSERTING_TAG );

            /* Issue #212 - WHY is this hard coded to 'IgnoreWhitespace' while an
               effort has been made above to set a 'MixedContent' mode in some cases?
               WHY IS THE 'mode' VARIABLE NOT USED HERE???? */

            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseBlock);
                memory.reentry_node = node;
                memory.reentry_mode = mode;
                memory.original_node = element;
                TY_(pushMemory)(doc, memory);
                DEBUG_LOG_EXIT_WITH_NODE(node);
            }
            return node;
        }

        /* discard unexpected tags */
        if (node->type == EndTag)
            TY_(PopInline)( doc, node );  /* if inline end tag */

        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(Report)(doc, element, node, MISSING_ENDTAG_FOR);

    if (element->tag->model & CM_OBJECT)
    {
        /* pop inline stack */
        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
        lexer->istackbase = istackbase;
    }

    TrimSpaces( doc, element );

    DEBUG_LOG_EXIT;
    return NULL;
}